

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portable-file-dialogs.h
# Opt level: O2

void __thiscall
pfd::internal::file_dialog::file_dialog
          (file_dialog *this,type in_type,string *title,string *default_path,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filters,opt options)

{
  pointer pbVar1;
  string *__x;
  ostream *poVar2;
  char *__lhs;
  undefined3 in_register_00000089;
  ulong uVar3;
  long lVar4;
  string filter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  ulong local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  string *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  file_dialog *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_e0 = CONCAT44(local_e0._4_4_,CONCAT31(in_register_00000089,options));
  local_c0 = (string *)CONCAT44(local_c0._4_4_,in_type);
  dialog::dialog(&this->super_dialog);
  local_98 = this;
  dialog::desktop_helper_abi_cxx11_(&local_d8,&this->super_dialog);
  if (((settings::flags(pfd::settings::flag)::flags._2_1_ == '\0') &&
      (settings::flags(pfd::settings::flag)::flags._3_1_ == '\0')) &&
     (settings::flags(pfd::settings::flag)::flags._4_1_ != '\x01')) {
    if (settings::flags(pfd::settings::flag)::flags._5_1_ != '\x01') goto LAB_00108be2;
    if ((int)local_c0 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"--getopenfilename",(allocator<char> *)&local_b8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d8,
                 &local_100);
LAB_00108ccf:
      std::__cxx11::string::~string((string *)&local_100);
    }
    else {
      if ((int)local_c0 == 2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_100,"--getexistingdirectory",(allocator<char> *)&local_b8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d8,
                   &local_100);
        goto LAB_00108ccf;
      }
      if ((int)local_c0 == 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_100,"--getsavefilename",(allocator<char> *)&local_b8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d8,
                   &local_100);
        goto LAB_00108ccf;
      }
    }
    if ((local_e0 & 1) != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100," --multiple",(allocator<char> *)&local_b8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d8,
                 &local_100);
      std::__cxx11::string::~string((string *)&local_100);
    }
    local_c0 = title;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_d8,default_path);
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    local_100._M_string_length = 0;
    local_100.field_2._M_local_buf[0] = '\0';
    local_e0 = 0;
    for (uVar3 = 0;
        pbVar1 = (filters->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        uVar3 < (ulong)((long)(filters->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) >> 1;
        uVar3 = uVar3 + 1) {
      __lhs = " | ";
      if (uVar3 == 0) {
        __lhs = "";
      }
      std::operator+(&local_70,__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(pbVar1->_M_dataplus)._M_p + local_e0));
      std::operator+(&local_50,&local_70,"(");
      std::operator+(&local_90,&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(filters->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p +
                     local_e0));
      std::operator+(&local_b8,&local_90,")");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_100,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      local_e0 = local_e0 + 0x40;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_d8,&local_100);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"--title",(allocator<char> *)&local_90);
    __x = local_c0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d8,
               &local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_d8,__x);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"--file-selection",(allocator<char> *)&local_b8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d8,
               &local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::operator+(&local_100,"--filename=",default_path);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d8,
               &local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"--title",(allocator<char> *)&local_b8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d8,
               &local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_d8,title);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"--separator=\n",(allocator<char> *)&local_b8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d8,
               &local_100);
    std::__cxx11::string::~string((string *)&local_100);
    lVar4 = 0;
    for (uVar3 = 0;
        uVar3 < (ulong)((long)(filters->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(filters->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5) >> 1;
        uVar3 = uVar3 + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"--file-filter",(allocator<char> *)&local_b8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d8,
                 &local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::operator+(&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(((filters->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     lVar4),"|");
      std::operator+(&local_100,&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(filters->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p + lVar4)
                    );
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d8,
                 &local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_b8);
      lVar4 = lVar4 + 0x40;
    }
    if ((int)local_c0 == 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"--save",(allocator<char> *)&local_b8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d8,
                 &local_100);
LAB_00108b6c:
      std::__cxx11::string::~string((string *)&local_100);
    }
    else if ((int)local_c0 == 2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"--directory",(allocator<char> *)&local_b8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d8,
                 &local_100);
      goto LAB_00108b6c;
    }
    if ((local_e0 & 2) == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"--confirm-overwrite",(allocator<char> *)&local_b8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d8,
                 &local_100);
      std::__cxx11::string::~string((string *)&local_100);
    }
    if ((local_e0 & 1) == 0) goto LAB_00108be2;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"--multiple",(allocator<char> *)&local_b8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d8,
               &local_100);
  }
  std::__cxx11::string::~string((string *)&local_100);
LAB_00108be2:
  if (settings::flags(pfd::settings::flag)::flags._1_1_ == '\x01') {
    poVar2 = std::operator<<((ostream *)&std::cerr,"pfd: ");
    poVar2 = operator<<(poVar2,&local_d8);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  executor::start_process
            ((local_98->super_dialog).m_async.
             super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8);
  return;
}

Assistant:

inline internal::file_dialog::file_dialog(type in_type,
            std::string const &title,
            std::string const &default_path /* = "" */,
            std::vector<std::string> const &filters /* = {} */,
            opt options /* = opt::none */)
{
#if _WIN32
    std::string filter_list;
    std::regex whitespace("  *");
    for (size_t i = 0; i + 1 < filters.size(); i += 2)
    {
        filter_list += filters[i] + '\0';
        filter_list += std::regex_replace(filters[i + 1], whitespace, ";") + '\0';
    }
    filter_list += '\0';

    m_async->start_func([this, in_type, title, default_path, filter_list,
                         options](int *exit_code) -> std::string
    {
        (void)exit_code;
        m_wtitle = internal::str2wstr(title);
        m_wdefault_path = internal::str2wstr(default_path);
        auto wfilter_list = internal::str2wstr(filter_list);

        // Folder selection uses a different method
        if (in_type == type::folder)
        {
            dll ole32("ole32.dll");

            auto status = dll::proc<HRESULT WINAPI (LPVOID, DWORD)>(ole32, "CoInitializeEx")
                              (nullptr, COINIT_APARTMENTTHREADED);
            if (flags(flag::is_vista))
            {
                // On Vista and higher we should be able to use IFileDialog for folder selection
                IFileDialog *ifd;
                HRESULT hr = dll::proc<HRESULT WINAPI (REFCLSID, LPUNKNOWN, DWORD, REFIID, LPVOID *)>(ole32, "CoCreateInstance")
                                 (CLSID_FileOpenDialog, nullptr, CLSCTX_INPROC_SERVER, IID_PPV_ARGS(&ifd));

                // In case CoCreateInstance fails (which it should not), try legacy approach
                if (SUCCEEDED(hr))
                    return select_folder_vista(ifd, options & opt::force_path);
            }

            BROWSEINFOW bi;
            memset(&bi, 0, sizeof(bi));

            bi.lpfn = &bffcallback;
            bi.lParam = (LPARAM)this;

            if (flags(flag::is_vista))
            {
                // This hangs on Windows XP, as reported here:
                // https://github.com/samhocevar/portable-file-dialogs/pull/21
                if (status == S_OK)
                    bi.ulFlags |= BIF_NEWDIALOGSTYLE;
                bi.ulFlags |= BIF_EDITBOX;
                bi.ulFlags |= BIF_STATUSTEXT;
            }

            auto *list = SHBrowseForFolderW(&bi);
            std::string ret;
            if (list)
            {
                auto buffer = new wchar_t[MAX_PATH];
                SHGetPathFromIDListW(list, buffer);
                dll::proc<void WINAPI (LPVOID)>(ole32, "CoTaskMemFree")(list);
                ret = internal::wstr2str(buffer);
                delete[] buffer;
            }
            if (status == S_OK)
                dll::proc<void WINAPI ()>(ole32, "CoUninitialize")();
            return ret;
        }

        OPENFILENAMEW ofn;
        memset(&ofn, 0, sizeof(ofn));
        ofn.lStructSize = sizeof(OPENFILENAMEW);
        ofn.hwndOwner = GetActiveWindow();

        ofn.lpstrFilter = wfilter_list.c_str();

        auto woutput = std::wstring(MAX_PATH * 256, L'\0');
        ofn.lpstrFile = (LPWSTR)woutput.data();
        ofn.nMaxFile = (DWORD)woutput.size();
        if (!m_wdefault_path.empty())
        {
            // If a directory was provided, use it as the initial directory. If
            // a valid path was provided, use it as the initial file. Otherwise,
            // let the Windows API decide.
            auto path_attr = GetFileAttributesW(m_wdefault_path.c_str());
            if (path_attr != INVALID_FILE_ATTRIBUTES && (path_attr & FILE_ATTRIBUTE_DIRECTORY))
                ofn.lpstrInitialDir = m_wdefault_path.c_str();
            else if (m_wdefault_path.size() <= woutput.size())
                //second argument is size of buffer, not length of string
                StringCchCopyW(ofn.lpstrFile, MAX_PATH*256+1, m_wdefault_path.c_str());
            else
            {
                ofn.lpstrFileTitle = (LPWSTR)m_wdefault_path.data();
                ofn.nMaxFileTitle = (DWORD)m_wdefault_path.size();
            }
        }
        ofn.lpstrTitle = m_wtitle.c_str();
        ofn.Flags = OFN_NOCHANGEDIR | OFN_EXPLORER;

        dll comdlg32("comdlg32.dll");

        if (in_type == type::save)
        {
            if (!(options & opt::force_overwrite))
                ofn.Flags |= OFN_OVERWRITEPROMPT;

            // using set context to apply new visual style (required for windows XP)
            new_style_context ctx;

            dll::proc<BOOL WINAPI (LPOPENFILENAMEW)> get_save_file_name(comdlg32, "GetSaveFileNameW");
            if (get_save_file_name(&ofn) == 0)
                return "";
            return internal::wstr2str(woutput.c_str());
        }

        if (options & opt::multiselect)
            ofn.Flags |= OFN_ALLOWMULTISELECT;
        ofn.Flags |= OFN_PATHMUSTEXIST;

        // using set context to apply new visual style (required for windows XP)
        new_style_context ctx;

        dll::proc<BOOL WINAPI (LPOPENFILENAMEW)> get_open_file_name(comdlg32, "GetOpenFileNameW");
        if (get_open_file_name(&ofn) == 0)
            return "";

        std::string prefix;
        for (wchar_t const *p = woutput.c_str(); *p; )
        {
            auto filename = internal::wstr2str(p);
            p += wcslen(p);
            // In multiselect mode, we advance p one wchar further and
            // check for another filename. If there is one and the
            // prefix is empty, it means we just read the prefix.
            if ((options & opt::multiselect) && *++p && prefix.empty())
            {
                prefix = filename + "/";
                continue;
            }

            m_vector_result.push_back(prefix + filename);
        }

        return "";
    });
#else
    auto command = desktop_helper();

    if (is_osascript())
    {
        std::string script = "set ret to choose";
        switch (in_type)
        {
            case type::save:
                script += " file name";
                break;
            case type::open: default:
                script += " file";
                if (options & opt::multiselect)
                    script += " with multiple selections allowed";
                break;
            case type::folder:
                script += " folder";
                break;
        }

        if (default_path.size())
            script += " default location " + osascript_quote(default_path);
        script += " with prompt " + osascript_quote(title);

        if (in_type == type::open)
        {
            // Concatenate all user-provided filter patterns
            std::string patterns;
            for (size_t i = 0; i < filters.size() / 2; ++i)
                patterns += " " + filters[2 * i + 1];

            // Split the pattern list to check whether "*" is in there; if it
            // is, we have to disable filters because there is no mechanism in
            // OS X for the user to override the filter.
            std::regex sep("\\s+");
            std::string filter_list;
            bool has_filter = true;
            std::sregex_token_iterator iter(patterns.begin(), patterns.end(), sep, -1);
            std::sregex_token_iterator end;
            for ( ; iter != end; ++iter)
            {
                auto pat = iter->str();
                if (pat == "*" || pat == "*.*")
                    has_filter = false;
                else if (internal::starts_with(pat, "*."))
                    filter_list += (filter_list.size() == 0 ? "" : ",") +
                                   osascript_quote(pat.substr(2, pat.size() - 2));
            }
            if (has_filter && filter_list.size() > 0)
                script += " of type {" + filter_list + "}";
        }

        if (in_type == type::open && (options & opt::multiselect))
        {
            script += "\nset s to \"\"";
            script += "\nrepeat with i in ret";
            script += "\n  set s to s & (POSIX path of i) & \"\\n\"";
            script += "\nend repeat";
            script += "\ncopy s to stdout";
        }
        else
        {
            script += "\nPOSIX path of ret";
        }

        command.push_back("-e");
        command.push_back(script);
    }
    else if (is_zenity())
    {
        command.push_back("--file-selection");
        command.push_back("--filename=" + default_path);
        command.push_back("--title");
        command.push_back(title);
        command.push_back("--separator=\n");

        for (size_t i = 0; i < filters.size() / 2; ++i)
        {
            command.push_back("--file-filter");
            command.push_back(filters[2 * i] + "|" + filters[2 * i + 1]);
        }

        if (in_type == type::save)
            command.push_back("--save");
        if (in_type == type::folder)
            command.push_back("--directory");
        if (!(options & opt::force_overwrite))
            command.push_back("--confirm-overwrite");
        if (options & opt::multiselect)
            command.push_back("--multiple");
    }
    else if (is_kdialog())
    {
        switch (in_type)
        {
            case type::save: command.push_back("--getsavefilename"); break;
            case type::open: command.push_back("--getopenfilename"); break;
            case type::folder: command.push_back("--getexistingdirectory"); break;
        }
        if (options & opt::multiselect)
            command.push_back(" --multiple");

        command.push_back(default_path);

        std::string filter;
        for (size_t i = 0; i < filters.size() / 2; ++i)
            filter += (i == 0 ? "" : " | ") + filters[2 * i] + "(" + filters[2 * i + 1] + ")";
        command.push_back(filter);

        command.push_back("--title");
        command.push_back(title);
    }

    if (flags(flag::is_verbose))
        std::cerr << "pfd: " << command << std::endl;

    m_async->start_process(command);
#endif
}